

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall CLPIParser::composeExtentInfo(CLPIParser *this,BitStreamWriter *writer)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  long lVar9;
  uint32_t *local_48;
  uint32_t *local_40;
  
  puVar3 = (writer->super_BitStream).m_initBuffer;
  iVar6 = (int)((*(int *)&(writer->super_BitStream).m_buffer - (int)puVar3) * 8 +
               writer->m_bitWrited) / 8;
  BitStreamWriter::putBits(writer,0x20,0);
  if ((this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->interleaveInfo).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x18,0);
    BitStreamWriter::putBits(writer,8,(uint)this->isDependStream * 2 + 1);
    BitStreamWriter::putBits(writer,0x20,0x20004);
    puVar4 = (writer->super_BitStream).m_initBuffer;
    iVar1 = *(int *)&(writer->super_BitStream).m_buffer;
    uVar7 = writer->m_bitWrited;
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x20,0);
    if (this->isDependStream == true) {
      BitStreamWriter::putBits(writer,0x20,0x20005);
      puVar5 = (writer->super_BitStream).m_initBuffer;
      local_48 = (uint32_t *)
                 ((long)((int)((*(int *)&(writer->super_BitStream).m_buffer - (int)puVar5) * 8 +
                              writer->m_bitWrited) / 8) + (long)puVar5);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0x20006);
      puVar5 = (writer->super_BitStream).m_initBuffer;
      local_40 = (uint32_t *)
                 ((long)((int)((*(int *)&(writer->super_BitStream).m_buffer - (int)puVar5) * 8 +
                              writer->m_bitWrited) / 8) + (long)puVar5);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0);
    }
    else {
      local_40 = (uint32_t *)0x0;
      local_48 = (uint32_t *)0x0;
    }
    lVar9 = (long)((int)((iVar1 - (int)puVar4) * 8 + uVar7) / 8);
    uVar7 = (*(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited;
    if ((uVar7 & 0x1f) != 0) {
      BitStreamWriter::putBits(writer,0x10,0);
      uVar7 = (*(int *)&(writer->super_BitStream).m_buffer -
              *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited;
    }
    uVar8 = my_ntohl((int)uVar7 / 8 - iVar6);
    *(uint32_t *)((long)puVar3 + (long)iVar6 + 4) = uVar8;
    uVar8 = my_ntohl((int)((*(int *)&(writer->super_BitStream).m_buffer -
                           *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                          writer->m_bitWrited) / 8 - iVar6);
    *(uint32_t *)((long)puVar4 + lVar9) = uVar8;
    iVar1 = *(int *)&(writer->super_BitStream).m_buffer;
    iVar2 = *(int *)&(writer->super_BitStream).m_initBuffer;
    uVar7 = writer->m_bitWrited;
    composeExtentStartPoint(this,writer);
    uVar8 = my_ntohl((int)((iVar1 - iVar2) * 8 + uVar7) / -8 +
                     (int)((*(int *)&(writer->super_BitStream).m_buffer -
                           *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                          writer->m_bitWrited) / 8);
    *(uint32_t *)((long)puVar4 + lVar9 + 4) = uVar8;
    if (this->isDependStream == true) {
      uVar8 = my_ntohl((int)((*(int *)&(writer->super_BitStream).m_buffer -
                             *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                            writer->m_bitWrited) / 8 - iVar6);
      *local_48 = uVar8;
      iVar1 = *(int *)&(writer->super_BitStream).m_buffer;
      iVar2 = *(int *)&(writer->super_BitStream).m_initBuffer;
      uVar7 = writer->m_bitWrited;
      composeProgramInfo(this,writer,true);
      uVar8 = my_ntohl((int)((iVar1 - iVar2) * 8 + uVar7) / -8 +
                       (int)((*(int *)&(writer->super_BitStream).m_buffer -
                             *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                            writer->m_bitWrited) / 8);
      local_48[1] = uVar8;
      uVar8 = my_ntohl((int)((*(int *)&(writer->super_BitStream).m_buffer -
                             *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                            writer->m_bitWrited) / 8 - iVar6);
      *local_40 = uVar8;
      iVar1 = *(int *)&(writer->super_BitStream).m_buffer;
      iVar2 = *(int *)&(writer->super_BitStream).m_initBuffer;
      uVar7 = writer->m_bitWrited;
      composeCPI(this,writer,true);
      uVar8 = my_ntohl((int)((iVar1 - iVar2) * 8 + uVar7) / -8 +
                       (int)((*(int *)&(writer->super_BitStream).m_buffer -
                             *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                            writer->m_bitWrited) / 8);
      local_40[1] = uVar8;
    }
    uVar8 = my_ntohl(((int)((*(int *)&(writer->super_BitStream).m_buffer -
                            *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                           writer->m_bitWrited) / 8 - iVar6) - 4);
    *(uint32_t *)((long)puVar3 + (long)iVar6) = uVar8;
  }
  return;
}

Assistant:

void CLPIParser::composeExtentInfo(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(32, 0);  // length

    if (interleaveInfo.empty())
        return;

    writer.putBits(32, 0);  // skip data block start address
    writer.putBits(24, 0);  // reserved for world align

    const int entries = isDependStream ? 3 : 1;
    writer.putBits(8, entries);

    // write Extent_Start_Point header

    writer.putBits(32, 0x00020004);  // extent start point
    const auto extentStartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

    writer.putBits(32, 0);  // skip extent start address
    writer.putBits(32, 0);  // skip extent dataLen

    uint32_t* CPI_SS_StartPos = nullptr;
    uint32_t* ProgramInfo_StartPos = nullptr;
    if (isDependStream)
    {
        // write ProgramInfo_SS header
        writer.putBits(32, 0x00020005);  // extent start point
        ProgramInfo_StartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

        writer.putBits(32, 0);  // skip extent start address
        writer.putBits(32, 0);  // skip extent dataLen

        // write CPI_SS header
        writer.putBits(32, 0x00020006);  // extent start point
        CPI_SS_StartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

        writer.putBits(32, 0);  // skip extent start address
        writer.putBits(32, 0);  // skip extent dataLen
    }

    if (writer.getBitsCount() % 32)
        writer.putBits(16, 0);

    lengthPos[1] =
        my_htonl(writer.getBitsCount() / 8 - beforeCount);  // data_block_start_address, same as extentStart point start

    // write Extent_Start_Point body
    *extentStartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
    int beforeExtentCount = writer.getBitsCount() / 8;
    composeExtentStartPoint(writer);
    extentStartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);

    if (isDependStream)
    {
        // write ProgramInfo_SS body
        *ProgramInfo_StartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
        beforeExtentCount = writer.getBitsCount() / 8;
        composeProgramInfo(writer, true);
        ProgramInfo_StartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);

        // write CPI_SS body
        *CPI_SS_StartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
        beforeExtentCount = writer.getBitsCount() / 8;
        composeCPI(writer, true);
        CPI_SS_StartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount - 4);
}